

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O3

IDenseNetwork * __thiscall IDenseNetwork::Reset(IDenseNetwork *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar1 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_ILayer[6])();
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::Reset()
{
    for ( auto layer: layers ) {
        layer->ResetPotentials();
    }
    return *this;
}